

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

size_t __thiscall OpenSSLWrapper::SslConnection::SslGetOutDataSize(SslConnection *this)

{
  runtime_error *this_00;
  size_t sVar1;
  SslConnection *this_local;
  
  if (this->m_ssl == (SSL *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Not Initialized");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar1 = BIO_ctrl_pending((BIO *)this->m_rbio);
  return sVar1;
}

Assistant:

size_t SslConnection::SslGetOutDataSize()
    {
        if (nullptr == m_ssl)
            throw runtime_error("Not Initialized");

        return BIO_ctrl_pending(m_rbio);
    }